

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binds.c
# Opt level: O1

LispPTR * N_OP_bind(LispPTR *stack_pointer,LispPTR tos,uint byte1,uint byte2)

{
  LispPTR *pLVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  DLword *__s;
  LispPTR *pLVar5;
  
  uVar4 = byte1 & 0xf;
  if (byte1 < 0x10) {
    __s = MachineState.pvar + (ulong)byte2 * 2 + 2;
  }
  else {
    uVar3 = (ulong)((byte1 >> 4) - 1);
    __s = MachineState.pvar + (byte2 - uVar3) * 2;
    memset(__s,0,uVar3 * 4 + 4);
  }
  if (uVar4 == 0) {
    *stack_pointer = tos;
    stack_pointer = stack_pointer + 1;
  }
  else {
    *(LispPTR *)(__s + -2) = tos;
    if (uVar4 != 1) {
      iVar2 = uVar4 - 1;
      pLVar5 = (LispPTR *)(__s + -4);
      do {
        pLVar1 = stack_pointer + -1;
        stack_pointer = stack_pointer + -1;
        *pLVar5 = *pLVar1;
        pLVar5 = pLVar5 + -1;
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
  }
  *stack_pointer = byte2 * 2 | ~((byte1 >> 4) + uVar4) << 0x10;
  return stack_pointer;
}

Assistant:

LispPTR *N_OP_bind(LispPTR *stack_pointer, LispPTR tos, unsigned byte1, unsigned byte2) {
  unsigned n1;         /* # slots to bind to NIL (0, 0) */
  unsigned n2;         /* # slots to bind to value in stack */
  LispPTR *ppvar; /* pointer to argued slot in Pvar area */
  unsigned i;          /* temporary for control */

#ifdef TRACE
  printPC();
  printf("TRACE: N_OP_bind()\n");
#endif

  n1 = byte1 >> 4;
  n2 = byte1 & 0xf;
  ppvar = (LispPTR *)PVar + 1 + byte2;

  for (i = 0; i < n1; i++) { *--ppvar = NIL_PTR; }

  if (n2 == 0) {
    *stack_pointer++ = tos; /* push TopOfStack to Evaluation stack */
  } else {
    *--ppvar = tos; /* bind to TopOfStack */
    for (i = 1; i < n2; i++) { *--ppvar = *(--stack_pointer); }
  }

  i = ~(n1 + n2); /* x: 1's complement of number of bind slots */
  *stack_pointer = (i << 16) | (byte2 << 1);
  return (stack_pointer);
}